

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O3

int isearch(int dir)

{
  int iVar1;
  mgwin *pmVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ushort **ppuVar7;
  bool bVar8;
  char *pcVar9;
  line *plVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  int iVar16;
  ulong uVar17;
  undefined1 local_b8 [8];
  char opat [80];
  line *local_60;
  int local_48;
  uint local_44;
  int dir_local;
  uint local_3c;
  int local_38;
  int local_34;
  
  local_48 = dir;
  if (macrodef != 0) {
    dobeep();
    ewprintf("Can\'t isearch in macro");
    return 0;
  }
  lVar6 = 0;
  do {
    *(undefined4 *)((long)&cmds[0].s_code + lVar6) = 0xfffffffd;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0xc00);
  cip = 0x80;
  strlcpy(local_b8,pat,0x50);
  local_44 = 0xffffffff;
  local_60 = curwp->w_dotp;
  iVar16 = curwp->w_doto;
  iVar1 = curwp->w_dotline;
  cip = 1;
  cmds[1].s_code = 0;
  cmds[1].s_dotp = local_60;
  cmds[1].s_doto = iVar16;
  cmds[1].s_dotline = iVar1;
  is_prompt(dir,1,1);
  uVar13 = 0xffffffff;
  local_3c = 0xffffffff;
  local_34 = 1;
  uVar17 = 0xffffffff;
  dir_local = dir;
  local_38 = dir;
LAB_0011721c:
  iVar5 = (int)uVar13;
  update(2);
  uVar3 = getkey(0);
  pmVar2 = curwp;
  switch(uVar3) {
  case 7:
    if (local_34 == 1) {
      curwp->w_dotp = local_60;
      pmVar2->w_doto = iVar16;
      pmVar2->w_dotline = iVar1;
      pmVar2->w_rflag = pmVar2->w_rflag | 2;
      srch_lastdir = dir;
      ctrlg(8,0);
      strlcpy(pat,local_b8,0x50);
      return 2;
    }
    if (cmds[cip].s_code == -4) {
      do {
        is_undo((int *)&local_44,&local_48);
      } while (cmds[cip].s_code == -4);
      uVar13 = (ulong)local_44;
      local_3c = local_44;
      dir = local_48;
    }
    uVar17 = (ulong)local_3c;
    local_34 = 1;
    is_prompt(dir,local_3c >> 0x1f,1);
    dir_local = dir;
    local_38 = dir;
    goto LAB_0011721c;
  case 8:
    goto switchD_00117247_caseD_8;
  case 9:
  case 10:
    break;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
switchD_00117247_caseD_b:
    if ((cinfo[uVar3 & 0xff] & 8U) != 0) {
      ungetkey(uVar3);
      pmVar2 = curwp;
      curwp->w_markp = local_60;
      pmVar2->w_marko = iVar16;
      pmVar2->w_markline = iVar1;
      ewprintf("Mark set");
      curwp->w_rflag = curwp->w_rflag | 2;
      return 1;
    }
    break;
  case 0x11:
  case 0x1c:
    iVar4 = getkey(0);
    uVar3 = (uint)(char)iVar4;
    break;
  case 0x12:
    if (local_38 == -1) {
      dir = -2;
      local_48 = -2;
      iVar5 = cip + 1;
      if (0x7e < cip) {
        iVar5 = 0;
      }
      iVar4 = curwp->w_doto;
      cmds[iVar5].s_doto = iVar4;
      plVar10 = pmVar2->w_dotp;
      cmds[iVar5].s_dotp = plVar10;
      iVar11 = pmVar2->w_dotline;
      cmds[iVar5].s_dotline = iVar11;
      cip = iVar5;
      cmds[iVar5].s_code = -2;
      local_34 = 1;
      dir_local = -2;
      local_38 = -2;
    }
    else {
      if ((local_34 == 0) && (local_38 == -2)) {
        plVar10 = curbp->b_headp->l_bp;
        curwp->w_dotp = plVar10;
        pmVar2->w_doto = plVar10->l_used;
        pmVar2->w_dotline = pmVar2->w_bufp->b_lines;
        iVar5 = is_find(-2);
        if (iVar5 == 0) {
          local_34 = 0;
        }
        else {
          iVar5 = cip + 1;
          if (0x7e < cip) {
            iVar5 = 0;
          }
          cip = iVar5;
          cmds[iVar5].s_code = -5;
          local_34 = 1;
        }
        ewprintf("Overwrapped I-search: %s");
        local_38 = -2;
        goto LAB_0011721c;
      }
      iVar4 = curwp->w_doto;
      plVar10 = curwp->w_dotp;
      iVar11 = curwp->w_dotline;
      iVar5 = cip;
    }
    iVar12 = iVar5 + 1;
    if (0x7e < iVar5) {
      iVar12 = 0;
    }
    cmds[iVar12].s_code = -3;
    cmds[iVar12].s_doto = iVar4;
    cmds[iVar12].s_dotp = plVar10;
    cmds[iVar12].s_dotline = iVar11;
    uVar13 = strlen(pat);
    local_44 = (uint)uVar13;
    iVar5 = backchar(8,1);
    if (iVar5 == 0) {
LAB_0011799f:
      dobeep();
      local_34 = 0;
    }
    else {
      iVar5 = is_find(-2);
      if (iVar5 == 0) {
        forwchar(8,1);
        goto LAB_0011799f;
      }
      iVar5 = cip + 1;
      if (0x7e < cip) {
        iVar5 = 0;
      }
      cip = iVar5;
      cmds[iVar5].s_code = -5;
    }
    is_prompt(local_38,(uint)(uVar13 >> 0x1f) & 1,local_34);
    uVar17 = uVar13 & 0xffffffff;
    local_3c = (uint)uVar13;
    goto LAB_0011721c;
  case 0x13:
    if (dir_local == -2) {
      dir = -1;
      local_48 = -1;
      iVar5 = cip + 1;
      if (0x7e < cip) {
        iVar5 = 0;
      }
      iVar4 = curwp->w_doto;
      cmds[iVar5].s_doto = iVar4;
      plVar10 = pmVar2->w_dotp;
      cmds[iVar5].s_dotp = plVar10;
      iVar11 = pmVar2->w_dotline;
      cmds[iVar5].s_dotline = iVar11;
      cip = iVar5;
      cmds[iVar5].s_code = -1;
      local_34 = 1;
      dir_local = -1;
    }
    else {
      if ((local_34 == 0) && (dir_local == -1)) {
        curwp->w_dotp = curbp->b_headp->l_fp;
        pmVar2->w_doto = 0;
        pmVar2->w_dotline = 1;
        iVar5 = is_find(-1);
        if (iVar5 == 0) {
          local_34 = 0;
        }
        else {
          iVar5 = cip + 1;
          if (0x7e < cip) {
            iVar5 = 0;
          }
          cip = iVar5;
          cmds[iVar5].s_code = -5;
          local_34 = 1;
        }
        ewprintf("Overwrapped I-search: %s");
        dir_local = -1;
        local_38 = -1;
        goto LAB_0011721c;
      }
      iVar4 = curwp->w_doto;
      plVar10 = curwp->w_dotp;
      iVar11 = curwp->w_dotline;
      iVar5 = cip;
    }
    iVar12 = iVar5 + 1;
    if (0x7e < iVar5) {
      iVar12 = 0;
    }
    cmds[iVar12].s_code = -3;
    cmds[iVar12].s_doto = iVar4;
    cmds[iVar12].s_dotp = plVar10;
    cmds[iVar12].s_dotline = iVar11;
    uVar13 = strlen(pat);
    local_44 = (uint)uVar13;
    iVar5 = forwchar(8,1);
    if (iVar5 == 0) {
      dobeep();
LAB_00117960:
      iVar5 = 0;
      ewprintf("Failed I-search: %s",pat);
    }
    else {
      iVar5 = is_find(-1);
      if (iVar5 == 0) {
        backchar(8,1);
        dobeep();
        goto LAB_00117960;
      }
      iVar5 = cip + 1;
      if (0x7e < cip) {
        iVar5 = 0;
      }
      cip = iVar5;
      cmds[iVar5].s_code = -5;
      iVar5 = local_34;
    }
    iVar4 = dir_local;
    local_34 = iVar5;
    is_prompt(dir_local,(uint)(uVar13 >> 0x1f) & 1,iVar5);
    local_38 = iVar4;
    uVar17 = uVar13 & 0xffffffff;
    local_3c = (uint)uVar13;
    goto LAB_0011721c;
  case 0x17:
    goto switchD_00117247_caseD_17;
  case 0x1b:
    iVar5 = ttwait(300);
    if (iVar5 == 0) {
      ungetkey(0x1b);
    }
  case 0xd:
    pmVar2 = curwp;
    srch_lastdir = dir;
    curwp->w_markp = local_60;
    pmVar2->w_marko = iVar16;
    pmVar2->w_markline = iVar1;
    ewprintf("Mark set");
    return 1;
  default:
    if (uVar3 != 0x7f) goto switchD_00117247_caseD_b;
switchD_00117247_caseD_8:
    is_undo((int *)&local_44,&local_48);
    if (cmds[cip].s_code != -4) {
      local_34 = 1;
    }
    uVar13 = (ulong)local_44;
    uVar3 = local_44 >> 0x1f;
    dir = local_48;
    goto LAB_001173d3;
  }
  if (iVar5 == -1) {
    iVar5 = 0;
    local_34 = 1;
LAB_001172f7:
    lVar6 = (long)iVar5;
    uVar13 = lVar6 + 1;
    local_44 = (uint)uVar13;
    pat[lVar6] = (char)uVar3;
    pat[lVar6 + 1] = '\0';
  }
  else {
    if (iVar5 == 0) {
      local_34 = 1;
    }
    if (iVar5 != 0x4f) goto LAB_001172f7;
    dobeep();
    uVar13 = 0x4f;
  }
  iVar5 = cip + 1;
  if (0x7e < cip) {
    iVar5 = 0;
  }
  cmds[iVar5].s_code = -3;
  pmVar2 = curwp;
  cmds[iVar5].s_doto = curwp->w_doto;
  cmds[iVar5].s_dotp = pmVar2->w_dotp;
  cmds[iVar5].s_dotline = pmVar2->w_dotline;
  if (local_34 == 0) {
    cip = iVar5;
    cmds[iVar5].s_code = -4;
    local_34 = 0;
  }
  else {
    iVar5 = is_find(dir);
    if (iVar5 == 0) {
      dobeep();
      iVar5 = cip + 1;
      local_34 = 0;
      if (0x7e < cip) {
        iVar5 = 0;
      }
      cip = iVar5;
      cmds[iVar5].s_code = -4;
    }
    else {
      iVar5 = cip + 1;
      if (0x7e < cip) {
        iVar5 = 0;
      }
      cip = iVar5;
      cmds[iVar5].s_code = uVar3;
      local_34 = 1;
    }
  }
  uVar3 = 0;
LAB_001173d3:
  is_prompt(dir,uVar3,local_34);
  uVar17 = uVar13 & 0xffffffff;
  dir_local = dir;
  local_3c = (uint)uVar13;
  local_38 = dir;
  goto LAB_0011721c;
switchD_00117247_caseD_17:
  uVar13 = uVar17;
  if ((int)uVar17 == -1) {
    uVar13 = 0;
  }
  iVar5 = 0;
  if (local_38 == -2) {
    iVar5 = (int)uVar13;
  }
  if (pat[0] == '\0') {
    local_3c = CONCAT31(local_3c._1_3_,1);
  }
  else {
    pcVar9 = pat;
    bVar8 = false;
    bVar15 = pat[0];
    do {
      pcVar9 = (char *)((byte *)pcVar9 + 1);
      if ((cinfo[bVar15] & 2U) != 0) {
        bVar8 = true;
      }
      bVar15 = *pcVar9;
    } while (bVar15 != 0);
    local_3c = CONCAT31(local_3c._1_3_,!bVar8);
  }
  local_60 = curwp->w_dotp;
  iVar16 = iVar5 + curwp->w_doto;
  opat._76_4_ = dir;
  if (iVar16 < local_60->l_used) {
    lVar14 = (long)iVar16;
    lVar6 = (long)(int)uVar13;
    iVar16 = iVar5 + curwp->w_doto;
    bVar8 = false;
    do {
      iVar16 = iVar16 + 1;
      bVar15 = local_60->l_text[lVar14];
      if ((bVar8) && (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[bVar15] & 8) == 0)) break;
      if (lVar6 == 0x4f) {
        local_44 = 0x4f;
        dobeep();
        uVar13 = 0x4f;
        goto LAB_00117a14;
      }
      if ((char)local_3c != '\0') {
        bVar15 = bVar15 + (cinfo[bVar15] & 2U) * '\x10';
      }
      pat[lVar6] = bVar15;
      pat[lVar6 + 1] = '\0';
      pmVar2 = curwp;
      if (local_38 == -1) {
        curwp->w_doto = iVar16;
        pmVar2->w_rflag = pmVar2->w_rflag | 2;
        update(2);
      }
      lVar14 = lVar14 + 1;
      lVar6 = lVar6 + 1;
      uVar13 = (ulong)((int)uVar13 + 1);
      bVar8 = true;
    } while (lVar14 < local_60->l_used);
  }
  local_44 = (uint)uVar13;
LAB_00117a14:
  is_prompt(local_38,(int)(uVar13 >> 0x1f),local_34);
  uVar17 = uVar13;
  dir = opat._76_4_;
  local_3c = (uint)uVar13;
  goto LAB_0011721c;
}

Assistant:

static int
isearch(int dir)
{
	struct line	*clp;		/* Saved line pointer */
	int		 c;
	int		 cbo;		/* Saved offset */
	int		 success;
	int		 pptr;
	int		 firstc;
	int		 xcase;
	int		 i;
	char		 opat[NPAT];
	int		 cdotline;	/* Saved line number */

	if (macrodef) {
		dobeep();
		ewprintf("Can't isearch in macro");
		return (FALSE);
	}
	for (cip = 0; cip < NSRCH; cip++)
		cmds[cip].s_code = SRCH_NOPR;

	(void)strlcpy(opat, pat, sizeof(opat));
	cip = 0;
	pptr = -1;
	clp = curwp->w_dotp;
	cbo = curwp->w_doto;
	cdotline = curwp->w_dotline;
	is_lpush();
	is_cpush(SRCH_BEGIN);
	success = TRUE;
	is_prompt(dir, TRUE, success);

	for (;;) {
		update(CMODE);

		switch (c = getkey(FALSE)) {
		case CCHR('['):
			/*
			 * If new characters come in the next 300 msec,
			 * we can assume that they belong to a longer
			 * escaped sequence so we should ungetkey the
			 * ESC to avoid writing out garbage.
			 */
			if (ttwait(300) == FALSE)
				ungetkey(c);
			/* FALLTHRU */
		case CCHR('M'):
			srch_lastdir = dir;
			curwp->w_markp = clp;
			curwp->w_marko = cbo;
			curwp->w_markline = cdotline;
			ewprintf("Mark set");
			return (TRUE);
		case CCHR('G'):
			if (success != TRUE) {
				while (is_peek() == SRCH_ACCM)
					is_undo(&pptr, &dir);
				success = TRUE;
				is_prompt(dir, pptr < 0, success);
				break;
			}
			curwp->w_dotp = clp;
			curwp->w_doto = cbo;
			curwp->w_dotline = cdotline;
			curwp->w_rflag |= WFMOVE;
			srch_lastdir = dir;
			(void)ctrlg(FFRAND, 0);
			(void)strlcpy(pat, opat, sizeof(pat));
			return (ABORT);
		case CCHR('S'):
			if (dir == SRCH_BACK) {
				dir = SRCH_FORW;
				is_lpush();
				is_cpush(SRCH_FORW);
				success = TRUE;
			}
			if (success == FALSE && dir == SRCH_FORW) {
				/* wrap the search to beginning */
				curwp->w_dotp = bfirstlp(curbp);
				curwp->w_doto = 0;
				curwp->w_dotline = 1;
				if (is_find(dir) != FALSE) {
					is_cpush(SRCH_MARK);
					success = TRUE;
				}
				ewprintf("Overwrapped I-search: %s", pat);
				break;
			}
			is_lpush();
			pptr = strlen(pat);
			if (forwchar(FFRAND, 1) == FALSE) {
                                dobeep();
                                success = FALSE;
                                ewprintf("Failed I-search: %s", pat);
			} else {
				if (is_find(SRCH_FORW) != FALSE)
					is_cpush(SRCH_MARK);
				else {
					(void)backchar(FFRAND, 1);
					dobeep();
					success = FALSE;
					ewprintf("Failed I-search: %s", pat);
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('R'):
			if (dir == SRCH_FORW) {
				dir = SRCH_BACK;
				is_lpush();
				is_cpush(SRCH_BACK);
				success = TRUE;
			}
			if (success == FALSE && dir == SRCH_BACK) {
				/* wrap the search to end */
				curwp->w_dotp = blastlp(curbp);
				curwp->w_doto = llength(curwp->w_dotp);
				curwp->w_dotline = curwp->w_bufp->b_lines;
				if (is_find(dir) != FALSE) {
					is_cpush(SRCH_MARK);
					success = TRUE;
				}
				ewprintf("Overwrapped I-search: %s", pat);
				break;
			}
			is_lpush();
			pptr = strlen(pat);
                        if (backchar(FFRAND, 1) == FALSE) {
                                dobeep();
                                success = FALSE;
                        } else {
				if (is_find(SRCH_BACK) != FALSE)
					is_cpush(SRCH_MARK);
				else {
					(void)forwchar(FFRAND, 1);
					dobeep();
					success = FALSE;
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('W'):
			/* add the rest of the current word to the pattern */
			clp = curwp->w_dotp;
			cbo = curwp->w_doto;
			firstc = 1;
			if (pptr == -1)
				pptr = 0;
			if (dir == SRCH_BACK) {
				/* when isearching backwards, cbo is the start of the pattern */
				cbo += pptr;
			}

			/* if the search is case insensitive, add to pattern using lowercase */
			xcase = 0;
			for (i = 0; pat[i]; i++)
				if (ISUPPER(CHARMASK(pat[i])))
					xcase = 1;

			while (cbo < llength(clp)) {
				c = lgetc(clp, cbo++);
				if ((!firstc && !isalnum(c)))
					break;

				if (pptr == NPAT - 1) {
					dobeep();
					break;
				}
				firstc = 0;
				if (!xcase && ISUPPER(c))
					c = TOLOWER(c);

				pat[pptr++] = c;
				pat[pptr] = '\0';
				/* cursor only moves when isearching forwards */
				if (dir == SRCH_FORW) {
					curwp->w_doto = cbo;
					curwp->w_rflag |= WFMOVE;
					update(CMODE);
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('H'):
		case CCHR('?'):
			is_undo(&pptr, &dir);
			if (is_peek() != SRCH_ACCM)
				success = TRUE;
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('\\'):
		case CCHR('Q'):
			c = (char)getkey(FALSE);
			goto addchar;
		default:
			if (ISCTRL(c)) {
				ungetkey(c);
				curwp->w_markp = clp;
				curwp->w_marko = cbo;
				curwp->w_markline = cdotline;
				ewprintf("Mark set");
				curwp->w_rflag |= WFMOVE;
				return (TRUE);
			}
			/* FALLTHRU */
		case CCHR('I'):
		case CCHR('J'):
	addchar:
			if (pptr == -1)
				pptr = 0;
			if (pptr == 0)
				success = TRUE;
			if (pptr == NPAT - 1)
				dobeep();
			else {
				pat[pptr++] = c;
				pat[pptr] = '\0';
			}
			is_lpush();
			if (success != FALSE) {
				if (is_find(dir) != FALSE)
					is_cpush(c);
				else {
					success = FALSE;
					dobeep();
					is_cpush(SRCH_ACCM);
				}
			} else
				is_cpush(SRCH_ACCM);
			is_prompt(dir, FALSE, success);
		}
	}
	/* NOTREACHED */
}